

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

float mpack_expect_float(mpack_reader_t *reader)

{
  anon_union_8_8_6320e492_for_v aVar1;
  mpack_type_t mVar2;
  mpack_tag_t mVar3;
  float local_2c;
  float local_28;
  mpack_tag_t var;
  mpack_reader_t *reader_local;
  
  mVar3 = mpack_read_tag(reader);
  aVar1 = mVar3.v;
  mVar2 = mVar3.type;
  if (mVar2 == mpack_type_uint) {
    local_2c = (float)aVar1;
    reader_local._4_4_ = local_2c;
  }
  else if (mVar2 == mpack_type_int) {
    reader_local._4_4_ = (float)aVar1.i;
  }
  else if (mVar2 == mpack_type_float) {
    local_28 = mVar3.v._0_4_;
    reader_local._4_4_ = local_28;
  }
  else if (mVar2 == mpack_type_double) {
    reader_local._4_4_ = (float)aVar1.d;
  }
  else {
    mpack_reader_flag_error(reader,mpack_error_type);
    reader_local._4_4_ = 0.0;
  }
  return reader_local._4_4_;
}

Assistant:

float mpack_expect_float(mpack_reader_t* reader) {
    mpack_tag_t var = mpack_read_tag(reader);
    if (var.type == mpack_type_uint)
        return (float)var.v.u;
    else if (var.type == mpack_type_int)
        return (float)var.v.i;
    else if (var.type == mpack_type_float)
        return var.v.f;
    else if (var.type == mpack_type_double)
        return (float)var.v.d;
    mpack_reader_flag_error(reader, mpack_error_type);
    return 0.0f;
}